

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::solve_phase1(HDual *this)

{
  double dVar1;
  int status;
  char *ctx;
  HModel *pHVar2;
  double dVar3;
  
  HModel::util_reportMessage(this->model,"dual-phase-1-start");
  HModel::initBound(this->model,1);
  HModel::initValue(this->model);
  HTimer::getTime(&this->model->timer);
  do {
    rebuild(this);
    do {
      if (this->dual_variant == 1) {
        iterate_tasks(this);
      }
      else if (this->dual_variant == 2) {
        iterate_multi(this);
      }
      else {
        iterate(this);
      }
    } while (this->invertHint == 0);
    dVar1 = this->model->totalTime;
    dVar3 = HTimer::getTime(&this->model->timer);
    dVar3 = dVar3 + dVar1;
    if (this->TimeLimitValue <= dVar3 && dVar3 != this->TimeLimitValue) {
      this->SolveBailout = true;
      this->model->problemStatus = 6;
      return;
    }
    pHVar2 = this->model;
  } while (pHVar2->mlFg_haveFreshRebuild == 0);
  if ((this->SolveBailout & 1U) != 0) {
    return;
  }
  if (this->rowOut == -1) {
    ctx = "dual-phase-1-optimal";
    HModel::util_reportMessage(pHVar2,"dual-phase-1-optimal");
    pHVar2 = this->model;
    if ((pHVar2->objective != 0.0) || (NAN(pHVar2->objective))) {
      if (pHVar2->problemPerturbed == 0) {
        this->solvePhase = -1;
        HModel::util_reportMessage(pHVar2,"dual-infeasible");
        pHVar2 = this->model;
        status = 2;
        goto LAB_0011d457;
      }
      goto LAB_0011d421;
    }
  }
  else {
    if (this->columnIn != -1) goto LAB_0011d45d;
    ctx = "dual-phase-1-unbounded";
    HModel::util_reportMessage(pHVar2,"dual-phase-1-unbounded");
    if (this->model->problemPerturbed == 0) {
      this->solvePhase = -1;
      HModel::util_reportMessage(this->model,"dual-phase-1-not-solved");
      pHVar2 = this->model;
      status = 4;
LAB_0011d457:
      HModel::setProblemStatus(pHVar2,status);
      goto LAB_0011d45d;
    }
LAB_0011d421:
    cleanup(this,(EVP_PKEY_CTX *)ctx);
    if (this->dualInfeasCount != 0) goto LAB_0011d45d;
  }
  this->solvePhase = 2;
LAB_0011d45d:
  if (this->solvePhase != 2) {
    return;
  }
  HModel::initBound(this->model,2);
  HModel::initValue(this->model);
  return;
}

Assistant:

void HDual::solve_phase1() {
	model->util_reportMessage("dual-phase-1-start");
	// Switch to dual phase 1 bounds
	model->initBound(1);
	model->initValue();
	double lc_totalTime = model->totalTime + model->timer.getTime();
#ifdef JAJH_dev
	int lc_totalTime_rp_n = 0;
	//	printf("DualPh1: lc_totalTime = %5.2f; Record %d\n", lc_totalTime, lc_totalTime_rp_n);
#endif
	// Main solving structure
	for (;;) {
		rebuild();
		for (;;) {
			switch (dual_variant) {
			default:
			case HDUAL_VARIANT_PLAIN:
				iterate();
				break;
			case HDUAL_VARIANT_TASKS:
				iterate_tasks();
				break;
			case HDUAL_VARIANT_MULTI:
				iterate_multi();
				break;
			}
			if (invertHint)
				break;
			//printf("HDual::solve_phase1: Iter = %d; Objective = %g\n", model->numberIteration, model->objective);
			/*			if (model->objective > model->dblOption[DBLOPT_OBJ_UB]) {
#ifdef SCIP_dev
			  printf("HDual::solve_phase1: %g = Objective > dblOption[DBLOPT_OBJ_UB]\n", model->objective, model->dblOption[DBLOPT_OBJ_UB]);
#endif
			  model->problemStatus = LP_Status_ObjUB; 
                          break;
			}
			*/
		}
		lc_totalTime = model->totalTime + model->timer.getTime();
#ifdef JAJH_dev
		lc_totalTime_rp_n += 1;
		//		printf("DualPh1: lc_totalTime = %5.2f; Record %d\n", lc_totalTime, lc_totalTime_rp_n);
#endif
		if (lc_totalTime > TimeLimitValue) {
		  SolveBailout = true;
		  model->problemStatus = LP_Status_OutOfTime;
		  break;
		}
		// If the data are fresh from rebuild(), break out of
		// the outer loop to see what's ocurred
		// Was:	if (model->countUpdate == 0) break;
		if (model->mlFg_haveFreshRebuild) break;
	}

	if (SolveBailout) return;

	if (rowOut == -1) {
		model->util_reportMessage("dual-phase-1-optimal");
		// Go to phase 2
		if (model->objective == 0) {
			solvePhase = 2;
		} else {
			// We still have dual infeasible
			if (model->problemPerturbed) {
				// Clean up perturbation and go on
				cleanup();
				if (dualInfeasCount == 0)
					solvePhase = 2;
			} else {
				// Report dual infeasible
				solvePhase = -1;
				model->util_reportMessage("dual-infeasible");
				model->setProblemStatus(LP_Status_Unbounded);
			}
		}
	} else if (columnIn == -1) {
		// We got dual phase 1 unbounded - strange
		model->util_reportMessage("dual-phase-1-unbounded");
		if (model->problemPerturbed) {
			// Clean up perturbation and go on
			cleanup();
			if (dualInfeasCount == 0)
				solvePhase = 2;
		} else {
			// Report strange issues
			solvePhase = -1;
			model->util_reportMessage("dual-phase-1-not-solved");
			model->setProblemStatus(LP_Status_Failed);
		}
	}

	if (solvePhase == 2) {
		model->initBound();
		model->initValue();
	}

}